

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty_shellcode.c
# Opt level: O2

int main(void)

{
  char *name [2];
  
  close(0);
  open("/dev/tty",2);
  name[0] = "/bin/sh";
  name[1] = (char *)0x0;
  execve("/bin/sh",name,(char **)0x0);
  return 0;
}

Assistant:

int main(void) {
  close(0);
  open("/dev/tty", O_RDWR);
  char * name[2];
  name[0] = "/bin/sh";
  name[1] = NULL;
  execve(name[0], name, NULL);
}